

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined8 *puVar8;
  N_Vector u;
  void *cvode_mem;
  long lVar9;
  N_Vector *pp_Var10;
  size_t sVar11;
  FILE *pFVar12;
  char *pcVar13;
  char *__format;
  undefined4 uVar14;
  SUNContext sunctx;
  sunrealtype t;
  char fname [256];
  undefined8 local_1a0;
  int local_194;
  double local_190;
  undefined8 *local_188;
  N_Vector *local_180;
  long local_178;
  long local_170;
  void *local_168;
  sunrealtype local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  char local_138 [8];
  undefined8 uStack_130;
  undefined1 uStack_128;
  char acStack_127 [247];
  
  if (argc < 2) {
LAB_00102c60:
    WrongArgs(*argv);
  }
  pcVar13 = argv[1];
  iVar4 = strcmp(pcVar13,"-nosensi");
  uVar14 = 0;
  bVar3 = true;
  if (iVar4 == 0) {
    iVar5 = -1;
  }
  else {
    iVar5 = strcmp(pcVar13,"-sensi");
    if ((iVar5 != 0) || (argc != 4)) goto LAB_00102c60;
    pcVar13 = argv[2];
    iVar5 = strcmp(pcVar13,"sim");
    if (iVar5 == 0) {
      iVar5 = 1;
    }
    else {
      iVar5 = strcmp(pcVar13,"stg");
      if (iVar5 == 0) {
        iVar5 = 2;
      }
      else {
        iVar6 = strcmp(pcVar13,"stg1");
        iVar5 = 3;
        if (iVar6 != 0) goto LAB_00102c60;
      }
    }
    pcVar13 = argv[3];
    if (*pcVar13 == 'f') {
      uVar14 = 0;
      if (pcVar13[1] != '\0') goto LAB_00102c60;
    }
    else {
      if ((*pcVar13 != 't') || (pcVar13[1] != '\0')) goto LAB_00102c60;
      bVar3 = false;
      uVar14 = 1;
    }
  }
  puVar8 = (undefined8 *)malloc(0x18);
  if (puVar8 == (undefined8 *)0x0) {
    main_cold_6();
    return 1;
  }
  *(undefined4 *)puVar8 = 0x47ae147b;
  *(undefined4 *)((long)puVar8 + 4) = 0x3fa47ae1;
  *(undefined4 *)(puVar8 + 1) = 0;
  *(undefined4 *)((long)puVar8 + 0xc) = 0x40c38800;
  puVar8[2] = 0x417c9c3800000000;
  uVar7 = SUNContext_Create(0,&local_1a0);
  if ((int)uVar7 < 0) {
    pcVar13 = "SUNContext_Create";
  }
  else {
    u = (N_Vector)N_VNew_Serial(3,local_1a0);
    if (u == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    local_190 = (double)CONCAT44(local_190._4_4_,uVar14);
    puVar1 = *(undefined8 **)((long)u->content + 0x10);
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0;
    puVar1[2] = 0;
    cvode_mem = (void *)CVodeCreate(2,local_1a0);
    local_168 = cvode_mem;
    if (cvode_mem == (void *)0x0) {
      main_cold_4();
      return 1;
    }
    uVar7 = CVodeInit(0,cvode_mem,f,u);
    if ((int)uVar7 < 0) {
      pcVar13 = "CVodeInit";
    }
    else {
      uVar7 = CVodeWFtolerances(cvode_mem,ewt);
      if ((int)uVar7 < 0) {
        pcVar13 = "CVodeWFtolerances";
      }
      else {
        uVar7 = CVodeSetUserData(cvode_mem,puVar8);
        if ((int)uVar7 < 0) {
          pcVar13 = "CVodeSetUserData";
        }
        else {
          lVar9 = SUNDenseMatrix(3,3,local_1a0);
          if (lVar9 == 0) {
            main_cold_3();
            return 1;
          }
          local_170 = SUNLinSol_Dense(u,lVar9,local_1a0);
          if (local_170 == 0) {
            main_cold_2();
            return 1;
          }
          uVar7 = CVodeSetLinearSolver(cvode_mem,local_170,lVar9);
          if ((int)uVar7 < 0) {
            pcVar13 = "CVodeSetLinearSolver";
          }
          else {
            uVar7 = CVodeSetJacFn(cvode_mem,Jac);
            if ((int)uVar7 < 0) {
              pcVar13 = "CVodeSetJacFn";
            }
            else {
              puts(" \n3-species kinetics problem");
              local_194 = iVar5;
              local_188 = puVar8;
              local_178 = lVar9;
              if (iVar4 == 0) {
                pcVar13 = "Sensitivity: NO ";
                pp_Var10 = (N_Vector *)0x0;
LAB_001027fb:
                printf(pcVar13);
                puts("\n");
                printf("===========================================");
                puts("============================");
                printf("     T     Q       H      NST           y1");
                puts("           y2           y3    ");
                printf("===========================================");
                puts("============================");
                dVar2 = 0.4;
                iVar5 = 0xc;
                do {
                  local_190 = dVar2;
                  uVar7 = CVode(cvode_mem,u,&local_160,1);
                  if ((int)uVar7 < 0) {
                    pcVar13 = "CVode";
LAB_00102c1a:
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar13,
                            (ulong)uVar7);
                    break;
                  }
                  PrintOutput(cvode_mem,local_160,u);
                  if (iVar4 != 0) {
                    uVar7 = CVodeGetSens(cvode_mem,&local_160,pp_Var10);
                    if ((int)uVar7 < 0) {
                      pcVar13 = "CVodeGetSens";
                      goto LAB_00102c1a;
                    }
                    PrintOutputS(pp_Var10);
                  }
                  printf("-----------------------------------------");
                  puts("------------------------------");
                  dVar2 = local_190 * 10.0;
                  iVar5 = iVar5 + -1;
                } while (iVar5 != 0);
                puts("\nFinal Statistics:");
                CVodePrintAllStats(cvode_mem,_stdout,0);
                builtin_strncpy(local_138,"cvsRober",8);
                uStack_130._0_1_ = 0x74;
                uStack_130._1_7_ = 0x645f4153465f73;
                uStack_128 = 0x6e;
                builtin_strncpy(acStack_127,"s_stats",8);
                sVar11 = strlen(local_138);
                puVar8 = local_188;
                if (iVar4 == 0) {
                  builtin_strncpy(local_138 + sVar11,".csv",5);
                  pFVar12 = fopen(local_138,"w");
                  CVodePrintAllStats(cvode_mem,pFVar12,1);
                  fclose(pFVar12);
                  N_VDestroy(u);
                }
                else {
                  if (local_194 == 2) {
                    builtin_strncpy(local_138 + sVar11,"_-sensi_",8);
                    *(undefined4 *)((long)&uStack_130 + sVar11) = 0x677473;
                  }
                  else if (local_194 == 1) {
                    builtin_strncpy(local_138 + sVar11,"_-sensi_",8);
                    *(undefined4 *)((long)&uStack_130 + sVar11) = 0x6d6973;
                  }
                  else {
                    builtin_strncpy(local_138 + sVar11,"_-sensi_stg1",0xd);
                  }
                  sVar11 = strlen(local_138);
                  pcVar13 = local_138 + sVar11;
                  if (bVar3) {
                    local_138[sVar11 + 2] = '\0';
                    pcVar13[0] = '_';
                    pcVar13[1] = 'f';
                  }
                  else {
                    local_138[sVar11 + 2] = '\0';
                    pcVar13[0] = '_';
                    pcVar13[1] = 't';
                  }
                  sVar11 = strlen(local_138);
                  builtin_strncpy(local_138 + sVar11,".csv",5);
                  pFVar12 = fopen(local_138,"w");
                  CVodePrintAllStats(cvode_mem,pFVar12,1);
                  fclose(pFVar12);
                  N_VDestroy(u);
                  N_VDestroyVectorArray(pp_Var10,3);
                }
                free(puVar8);
                CVodeFree(&local_168);
                SUNLinSolFree(local_170);
                SUNMatDestroy(local_178);
                SUNContext_Free(&local_1a0);
                return 0;
              }
              local_158 = *puVar8;
              uStack_150 = puVar8[1];
              local_148 = puVar8[2];
              pp_Var10 = (N_Vector *)N_VCloneVectorArray(3,u);
              local_180 = pp_Var10;
              if (pp_Var10 == (N_Vector *)0x0) {
                main_cold_1();
                return 1;
              }
              lVar9 = 0;
              do {
                N_VConst(0,pp_Var10[lVar9]);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              uVar7 = CVodeSensInit1(cvode_mem,3,iVar5,fS,pp_Var10);
              if ((int)uVar7 < 0) {
                pcVar13 = "CVodeSensInit";
              }
              else {
                uVar7 = CVodeSensEEtolerances(cvode_mem);
                if ((int)uVar7 < 0) {
                  pcVar13 = "CVodeSensEEtolerances";
                }
                else {
                  uVar7 = CVodeSetSensErrCon(cvode_mem,(ulong)local_190 & 0xffffffff);
                  if ((int)uVar7 < 0) {
                    pcVar13 = "CVodeSetSensErrCon";
                  }
                  else {
                    uVar7 = CVodeSetSensParams(cvode_mem,0,&local_158,0);
                    if (-1 < (int)uVar7) {
                      printf("Sensitivity: YES ");
                      pcVar13 = "( STAGGERED1 +";
                      if (iVar5 == 2) {
                        pcVar13 = "( STAGGERED +";
                      }
                      __format = "( SIMULTANEOUS +";
                      if (iVar5 != 1) {
                        __format = pcVar13;
                      }
                      printf(__format);
                      pcVar13 = " FULL ERROR CONTROL )";
                      pp_Var10 = local_180;
                      if (bVar3) {
                        pcVar13 = " PARTIAL ERROR CONTROL )";
                      }
                      goto LAB_001027fb;
                    }
                    pcVar13 = "CVodeSetSensParams";
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar13,(ulong)uVar7);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  UserData data;
  FILE* FID;
  char fname[256];

  sunrealtype pbar[NS];
  int is;
  N_Vector* yS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  data      = NULL;
  y         = NULL;
  yS        = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Initialize sensitivity variables (reaction rates for this problem) */
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  Ith(y, 1) = Y1;
  Ith(y, 2) = Y2;
  Ith(y, 3) = Y3;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeWFtolerances to specify a user-supplied function ewt that sets
   * the multiplicative error weights w_i for use in the weighted RMS norm */
  retval = CVodeWFtolerances(cvode_mem, ewt);
  if (check_retval(&retval, "CVodeWFtolerances", 1)) { return (1); }

  /* Attach user data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  printf(" \n3-species kinetics problem\n");

  /* Sensitivity-related settings */
  if (sensi)
  {
    /* Set parameter scaling factor */
    pbar[0] = data->p[0];
    pbar[1] = data->p[1];
    pbar[2] = data->p[2];

    /* Set sensitivity initial conditions */
    yS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yS[is]); }

    /* Call CVodeSensInit1 to activate forward sensitivity computations
     * and allocate internal memory for COVEDS related to sensitivity
     * calculations. Computes the right-hand sides of the sensitivity
     * ODE, one at a time */
    retval = CVodeSensInit1(cvode_mem, NS, sensi_meth, fS, yS);
    if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

    /* Call CVodeSensEEtolerances to estimate tolerances for sensitivity
     * variables based on the rolerances supplied for states variables and
     * the scaling factor pbar */
    retval = CVodeSensEEtolerances(cvode_mem);
    if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

    /* Set sensitivity analysis optional inputs */
    /* Call CVodeSetSensErrCon to specify the error control strategy for
     * sensitivity variables */
    retval = CVodeSetSensErrCon(cvode_mem, err_con);
    if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

    /* Call CVodeSetSensParams to specify problem parameter information for
     * sensitivity calculations */
    retval = CVodeSetSensParams(cvode_mem, NULL, pbar, NULL);
    if (check_retval(&retval, "CVodeSetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == CV_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else if (sensi_meth == CV_STAGGERED) { printf("( STAGGERED +"); }
    else { printf("( STAGGERED1 +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */

  printf("\n\n");
  printf("===========================================");
  printf("============================\n");
  printf("     T     Q       H      NST           y1");
  printf("           y2           y3    \n");
  printf("===========================================");
  printf("============================\n");

  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout *= TMULT)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }

    PrintOutput(cvode_mem, t, y);

    /* Call CVodeGetSens to get the sensitivity solution vector after a
     * successful return from CVode */
    if (sensi)
    {
      retval = CVodeGetSens(cvode_mem, &t, yS);
      if (check_retval(&retval, "CVodeGetSens", 1)) { break; }
      PrintOutputS(yS);
    }
    printf("-----------------------------------------");
    printf("------------------------------\n");
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(cvode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  strcpy(fname, "cvsRoberts_FSA_dns_stats");
  if (sensi)
  {
    if (sensi_meth == CV_SIMULTANEOUS) { strcat(fname, "_-sensi_sim"); }
    else if (sensi_meth == CV_STAGGERED) { strcat(fname, "_-sensi_stg"); }
    else { strcat(fname, "_-sensi_stg1"); }
    if (err_con) { strcat(fname, "_t"); }
    else { strcat(fname, "_f"); }
  }
  strcat(fname, ".csv");
  FID    = fopen(fname, "w");
  retval = CVodePrintAllStats(cvode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  N_VDestroy(y); /* Free y vector */
  if (sensi) { N_VDestroyVectorArray(yS, NS); /* Free yS vector */ }
  free(data);               /* Free user data */
  CVodeFree(&cvode_mem);    /* Free CVODES memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (0);
}